

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzx.cpp
# Opt level: O3

bool mg::data::mzx_compress(string *raw,string *out,bool invert)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = raw->_M_string_length;
  std::__cxx11::string::resize((ulong)out,(char)uVar4 + (char)(uVar4 >> 7) * '\x02' + '\n');
  *(ulong *)(out->_M_dataplus)._M_p = uVar4 << 0x20 | 0x30585a4d;
  uVar4 = raw->_M_string_length;
  if (uVar4 == 0) {
    uVar3 = 8;
  }
  else {
    uVar5 = 0;
    uVar6 = 8;
    do {
      uVar4 = uVar4 - uVar5;
      if (0x7f < uVar4) {
        uVar4 = 0x80;
      }
      (out->_M_dataplus)._M_p[uVar6] =
           (((byte)uVar4 & 1) + ((byte)((uVar4 & 0xffffffff) >> 1) & 0x7f)) * '\x04' + -1;
      memcpy((out->_M_dataplus)._M_p + uVar6 + 1,(raw->_M_dataplus)._M_p + uVar5,uVar4);
      uVar3 = uVar4 + uVar6 + 1;
      uVar2 = uVar4;
      if (uVar6 + 1 < uVar3 && invert) {
        do {
          pbVar1 = (byte *)((out->_M_dataplus)._M_p + uVar6 + 1);
          *pbVar1 = ~*pbVar1;
          uVar6 = uVar6 + 1;
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
      }
      uVar5 = uVar5 + uVar4;
      uVar4 = raw->_M_string_length;
      uVar6 = uVar3;
    } while (uVar5 < uVar4);
  }
  std::__cxx11::string::resize((ulong)out,(char)uVar3);
  return true;
}

Assistant:

bool mzx_compress(const std::string &raw, std::string &out, bool invert) {
  // Don't bother actually compressing the data for now, just emit a valid
  // stream of literals
  MzxHeader header;
  memcpy(header.magic, MzxHeader::FILE_MAGIC, sizeof(header.magic));
  header.decompressed_size = raw.size();

  // Estimate our final size
  const std::string::size_type output_size =
      sizeof(header) + raw.size() + 2 * ((raw.size() / 128) + 1);
  out.resize(output_size);

  // Write header
  std::string::size_type output_offset = 0;
  header.to_file_order();
  memcpy(out.data(), &header, sizeof(header));
  output_offset += sizeof(header);

  for (std::string::size_type pos = 0; pos < raw.size();) {
    // Len field is 6 bits, each word is 2 bytes, we can write 128 bytes per
    // literal record
    const std::string::size_type bytes_remaining = raw.size() - pos;
    const unsigned bytes_to_write =
        bytes_remaining < 128 ? bytes_remaining : 128;

    // Convert that to a number of words to write.
    // If we have a trailing byte, that needs an extra word.
    uint8_t words_to_write = bytes_to_write / 2;
    if (bytes_to_write & 1) {
      words_to_write++;
    }

    // The number of words to write offset by one in the literal
    words_to_write--;

    // Pack the cmd
    uint8_t cmd = CMD_LITERAL | (words_to_write << 2);
    out[output_offset++] = cmd;

    // Write the next bytes_to_write datums
    memcpy(&out[output_offset], &raw[pos], bytes_to_write);
    if (invert) {
      for (std::string::size_type i = output_offset;
           i < output_offset + bytes_to_write; i++) {
        out[i] ^= 0xFF;
      }
    }
    output_offset += bytes_to_write;

    // Increment pos
    pos += bytes_to_write;
  }

  // Shrink the output size down to the bytes we actually wrote
  out.resize(output_offset);

  return true;
}